

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::DirectiveSyntax::setChild(DirectiveSyntax *this,size_t index,TokenOrSyntax child)

{
  logic_error *this_00;
  Token TVar1;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  DirectiveSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar1 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar1._0_8_;
    (this->directive).kind = (undefined2)local_28;
    (this->directive).field_0x2 = local_28._2_1_;
    (this->directive).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->directive).rawLen = local_28._4_4_;
    local_20 = TVar1.info;
    (this->directive).info = local_20;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
             ,&local_c9);
  std::operator+(&local_a8,&local_c8,":");
  std::__cxx11::to_string(&local_100,0x1114);
  std::operator+(&local_88,&local_a8,&local_100);
  std::operator+(&local_68,&local_88,": ");
  std::operator+(&local_48,&local_68,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DirectiveSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: directive = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}